

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O1

uint8_t get_image_version(FILE *fp)

{
  undefined8 in_RAX;
  size_t sVar1;
  long __off;
  byte bVar2;
  uint8_t header [5];
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  sVar1 = fread((void *)((long)&uStack_18 + 3),5,1,(FILE *)fp);
  if ((int)sVar1 != 1) {
    error_impl("get_image_version",0x40b,"get_image_version(): Unable to read version header data!")
    ;
  }
  __off = 0;
  bVar2 = 0;
  if ((((uStack_18._3_1_ == 'l') && (uStack_18._4_1_ == 's')) && (uStack_18._5_1_ == 't')) &&
     (__off = 0, uStack_18._6_1_ == '!')) {
    __off = 8;
    bVar2 = uStack_18._7_1_;
    if (2 < uStack_18._7_1_) {
      return uStack_18._7_1_;
    }
  }
  fseek((FILE *)fp,__off,0);
  return bVar2;
}

Assistant:

uint8_t get_image_version(FILE *fp)
{
    uint8_t header[IMAGE_HEADER_SIZE];
    int rc;

    rc = (int)fread(&header, sizeof(header), 1, fp);

    if(rc != 1) {
        error("get_image_version(): Unable to read version header data!");
    }

    if(header[0] == 'l' && header[1] == 's' && header[2] == 't' && header[3] == '!') {
        uint8_t ver = header[4];

        if(ver <= IMAGE_VERSION_2) {
            /* old version, seek past the extra 3 bytes. */
            fseek(fp, IMAGE_HEADER_SIZE_OLD, SEEK_SET);
        }

        return ver;
    } else {
        /* not a version with a header, seek back to the start. */
        fseek(fp, 0, SEEK_SET);
        return 0;
    }
}